

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_MapIterator_Next(upb_Map *map,size_t *iter)

{
  void *pvVar1;
  size_t *iter_local;
  upb_Map *map_local;
  
  pvVar1 = _upb_map_next(map,iter);
  return pvVar1 != (void *)0x0;
}

Assistant:

bool upb_MapIterator_Next(const upb_Map* map, size_t* iter) {
  return _upb_map_next(map, iter);
}